

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

CapabilityPipe * kj::newCapabilityPipe(void)

{
  AsyncPipe *pAVar1;
  Refcounted *refcounted;
  CapabilityPipe *in_RDI;
  Refcounted *refcounted_1;
  Own<kj::(anonymous_namespace)::TwoWayPipeEnd,_std::nullptr_t> OVar2;
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> local_88;
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> local_78;
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> local_68;
  Own<kj::(anonymous_namespace)::AsyncPipe,_std::nullptr_t> local_58;
  Disposer *local_48;
  AsyncCapabilityStream *pAStack_40;
  
  pAVar1 = (AsyncPipe *)operator_new(0x68);
  (pAVar1->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
  *(undefined8 *)&(pAVar1->super_Refcounted).refcount = 0;
  (pAVar1->ownState).ptr = (AsyncCapabilityStream *)0x0;
  *(undefined8 *)&pAVar1->readAborted = 0;
  (pAVar1->state).ptr = (AsyncCapabilityStream *)0x0;
  (pAVar1->ownState).disposer = (Disposer *)0x0;
  *(undefined8 *)&(pAVar1->readAbortPromise).ptr = 0;
  (pAVar1->readAbortPromise).ptr.field_1.value.hub.disposer = (Disposer *)0x0;
  (pAVar1->readAbortPromise).ptr.field_1.value.hub.ptr = (ForkHub<kj::_::Void> *)0x0;
  (pAVar1->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
  _vptr_AsyncInputStream = (_func_int **)&PTR_read_006de828;
  (pAVar1->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
  _vptr_AsyncOutputStream = (_func_int **)&PTR_write_006de8f8;
  (pAVar1->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_006de928
  ;
  *(undefined8 *)((long)&(pAVar1->ownState).disposer + 1) = 0;
  *(undefined8 *)((long)&(pAVar1->ownState).ptr + 1) = 0;
  (pAVar1->readAbortFulfiller).ptr.disposer = (Disposer *)0x0;
  (pAVar1->readAbortFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
  (pAVar1->readAbortPromise).ptr.isSet = false;
  (pAVar1->super_Refcounted).refcount = 1;
  local_68.disposer = &(pAVar1->super_Refcounted).super_Disposer;
  local_68.ptr = pAVar1;
  local_78.ptr = (AsyncPipe *)operator_new(0x68);
  local_78.disposer = &((local_78.ptr)->super_Refcounted).super_Disposer;
  ((local_78.ptr)->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
  *(undefined8 *)&((local_78.ptr)->super_Refcounted).refcount = 0;
  ((local_78.ptr)->ownState).ptr = (AsyncCapabilityStream *)0x0;
  *(undefined8 *)&(local_78.ptr)->readAborted = 0;
  ((local_78.ptr)->state).ptr = (AsyncCapabilityStream *)0x0;
  ((local_78.ptr)->ownState).disposer = (Disposer *)0x0;
  *(undefined8 *)&((local_78.ptr)->readAbortPromise).ptr = 0;
  ((local_78.ptr)->readAbortPromise).ptr.field_1.value.hub.disposer = (Disposer *)0x0;
  ((local_78.ptr)->readAbortPromise).ptr.field_1.value.hub.ptr = (ForkHub<kj::_::Void> *)0x0;
  ((local_78.ptr)->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
  _vptr_AsyncInputStream = (_func_int **)&PTR_read_006de828;
  ((local_78.ptr)->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
  _vptr_AsyncOutputStream = (_func_int **)&PTR_write_006de8f8;
  ((local_78.ptr)->super_Refcounted).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_006de928;
  *(undefined8 *)((long)&((local_78.ptr)->ownState).disposer + 1) = 0;
  *(undefined8 *)((long)&((local_78.ptr)->ownState).ptr + 1) = 0;
  ((local_78.ptr)->readAbortFulfiller).ptr.disposer = (Disposer *)0x0;
  ((local_78.ptr)->readAbortFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
  ((local_78.ptr)->readAbortPromise).ptr.isSet = false;
  (pAVar1->super_Refcounted).refcount = 2;
  ((local_78.ptr)->super_Refcounted).refcount = 2;
  local_88.disposer = &(pAVar1->super_Refcounted).super_Disposer;
  local_88.ptr = pAVar1;
  local_58.disposer = local_78.disposer;
  local_58.ptr = local_78.ptr;
  OVar2 = heap<kj::(anonymous_namespace)::TwoWayPipeEnd,kj::Own<kj::(anonymous_namespace)::AsyncPipe,decltype(nullptr)>,kj::Own<kj::(anonymous_namespace)::AsyncPipe,decltype(nullptr)>>
                    ((kj *)&local_48,&local_88,&local_58);
  if (local_58.ptr != (AsyncPipe *)0x0) {
    (**((Disposer *)&(local_58.disposer)->_vptr_Disposer)->_vptr_Disposer)
              (local_58.disposer,
               ((local_58.ptr)->super_AsyncCapabilityStream).super_AsyncIoStream.
               super_AsyncInputStream._vptr_AsyncInputStream[-2] +
               (long)&((local_58.ptr)->super_AsyncCapabilityStream).super_AsyncIoStream.
                      super_AsyncInputStream._vptr_AsyncInputStream,OVar2.ptr);
  }
  if (local_88.ptr != (AsyncPipe *)0x0) {
    (**((Disposer *)&(local_88.disposer)->_vptr_Disposer)->_vptr_Disposer)
              (local_88.disposer,
               ((local_88.ptr)->super_AsyncCapabilityStream).super_AsyncIoStream.
               super_AsyncInputStream._vptr_AsyncInputStream[-2] +
               (long)&((local_88.ptr)->super_AsyncCapabilityStream).super_AsyncIoStream.
                      super_AsyncInputStream._vptr_AsyncInputStream);
  }
  OVar2 = heap<kj::(anonymous_namespace)::TwoWayPipeEnd,kj::Own<kj::(anonymous_namespace)::AsyncPipe,decltype(nullptr)>,kj::Own<kj::(anonymous_namespace)::AsyncPipe,decltype(nullptr)>>
                    ((kj *)&local_88,&local_78,&local_68);
  in_RDI->ends[0].disposer = local_48;
  in_RDI->ends[0].ptr = pAStack_40;
  *(undefined4 *)&in_RDI->ends[1].disposer = local_88.disposer._0_4_;
  *(undefined4 *)((long)&in_RDI->ends[1].disposer + 4) = local_88.disposer._4_4_;
  *(undefined4 *)&in_RDI->ends[1].ptr = local_88.ptr._0_4_;
  *(undefined4 *)((long)&in_RDI->ends[1].ptr + 4) = local_88.ptr._4_4_;
  if (local_78.ptr != (AsyncPipe *)0x0) {
    (**((Disposer *)&(local_78.disposer)->_vptr_Disposer)->_vptr_Disposer)
              (local_78.disposer,
               ((local_78.ptr)->super_AsyncCapabilityStream).super_AsyncIoStream.
               super_AsyncInputStream._vptr_AsyncInputStream[-2] +
               (long)&((local_78.ptr)->super_AsyncCapabilityStream).super_AsyncIoStream.
                      super_AsyncInputStream._vptr_AsyncInputStream,OVar2.ptr);
  }
  if (local_68.ptr != (AsyncPipe *)0x0) {
    (**((Disposer *)&(local_68.disposer)->_vptr_Disposer)->_vptr_Disposer)
              (local_68.disposer,
               ((local_68.ptr)->super_AsyncCapabilityStream).super_AsyncIoStream.
               super_AsyncInputStream._vptr_AsyncInputStream[-2] +
               (long)&((local_68.ptr)->super_AsyncCapabilityStream).super_AsyncIoStream.
                      super_AsyncInputStream._vptr_AsyncInputStream);
  }
  return in_RDI;
}

Assistant:

CapabilityPipe newCapabilityPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}